

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O1

void enterFullscreenMode(_GLFWwindow *window)

{
  Atom AVar1;
  Atom AVar2;
  long lVar3;
  int ypos;
  int xpos;
  unsigned_long value;
  Window local_d0;
  Atom local_c8;
  undefined4 local_c0;
  long local_b8;
  Atom local_b0;
  long lStack_a8;
  long local_a0;
  undefined8 uStack_98;
  
  if (_glfw.x11.saver.count == 0) {
    XGetScreenSaver(_glfw.x11.display,0x114a3c,0x114a40,0x114a44,0x114a48);
    XSetScreenSaver(_glfw.x11.display,0,0,0,2);
  }
  _glfw.x11.saver.count = _glfw.x11.saver.count + 1;
  _glfwSetVideoMode(window->monitor,&window->videoMode);
  if (_glfw.x11.NET_WM_BYPASS_COMPOSITOR != 0) {
    value = 1;
    XChangeProperty(_glfw.x11.display,(window->x11).handle,_glfw.x11.NET_WM_BYPASS_COMPOSITOR,6,0x20
                    ,0,&value,1);
  }
  _glfwPlatformGetMonitorPos(window->monitor,&xpos,&ypos);
  _glfwPlatformGetVideoMode(window->monitor,(GLFWvidmode *)&value);
  XMoveResizeWindow(_glfw.x11.display,(window->x11).handle,xpos,ypos,value & 0xffffffff,value._4_4_)
  ;
  AVar1 = _glfw.x11.NET_WM_FULLSCREEN_MONITORS;
  if (_glfw.x11.NET_WM_FULLSCREEN_MONITORS != 0 && _glfw.x11.xinerama.available != '\0') {
    lVar3 = (long)(window->monitor->x11).index;
    memset(&value,0,0xc0);
    value = CONCAT44(value._4_4_,0x21);
    local_d0 = (window->x11).handle;
    local_c0 = 0x20;
    local_c8 = AVar1;
    uStack_98 = 0;
    local_b8 = lVar3;
    local_b0 = lVar3;
    lStack_a8 = lVar3;
    local_a0 = lVar3;
    XSendEvent(_glfw.x11.display,_glfw.x11.root,0,0x180000,&value);
  }
  AVar1 = _glfw.x11.NET_ACTIVE_WINDOW;
  if (_glfw.x11.NET_ACTIVE_WINDOW == 0) {
    XRaiseWindow(_glfw.x11.display,(window->x11).handle);
    XSetInputFocus(_glfw.x11.display,(window->x11).handle,2,0);
  }
  else {
    memset(&value,0,0xc0);
    value = CONCAT44(value._4_4_,0x21);
    local_d0 = (window->x11).handle;
    local_c0 = 0x20;
    local_c8 = AVar1;
    local_b8 = 1;
    local_a0 = 0;
    uStack_98 = 0;
    local_b0 = 0;
    lStack_a8 = 0;
    XSendEvent(_glfw.x11.display,_glfw.x11.root,0,0x180000,&value);
  }
  AVar2 = _glfw.x11.NET_WM_STATE_FULLSCREEN;
  AVar1 = _glfw.x11.NET_WM_STATE;
  if (_glfw.x11.NET_WM_STATE_FULLSCREEN != 0 && _glfw.x11.NET_WM_STATE != 0) {
    memset(&value,0,0xc0);
    value = CONCAT44(value._4_4_,0x21);
    local_d0 = (window->x11).handle;
    local_c0 = 0x20;
    local_c8 = AVar1;
    local_b8 = 1;
    local_b0 = AVar2;
    lStack_a8 = 0;
    local_a0 = 1;
    uStack_98 = 0;
    XSendEvent(_glfw.x11.display,_glfw.x11.root,0,0x180000,&value);
  }
  return;
}

Assistant:

static void enterFullscreenMode(_GLFWwindow* window)
{
    if (_glfw.x11.saver.count == 0)
    {
        // Remember old screen saver settings
        XGetScreenSaver(_glfw.x11.display,
                        &_glfw.x11.saver.timeout,
                        &_glfw.x11.saver.interval,
                        &_glfw.x11.saver.blanking,
                        &_glfw.x11.saver.exposure);

        // Disable screen saver
        XSetScreenSaver(_glfw.x11.display, 0, 0, DontPreferBlanking,
                        DefaultExposures);
    }

    _glfw.x11.saver.count++;

    _glfwSetVideoMode(window->monitor, &window->videoMode);

    if (_glfw.x11.NET_WM_BYPASS_COMPOSITOR)
    {
        const unsigned long value = 1;

        XChangeProperty(_glfw.x11.display,  window->x11.handle,
                        _glfw.x11.NET_WM_BYPASS_COMPOSITOR, XA_CARDINAL, 32,
                        PropModeReplace, (unsigned char*) &value, 1);
    }

    // Position the window over its monitor
    {
        int xpos, ypos;
        GLFWvidmode mode;

        _glfwPlatformGetMonitorPos(window->monitor, &xpos, &ypos);
        _glfwPlatformGetVideoMode(window->monitor, &mode);

        XMoveResizeWindow(_glfw.x11.display, window->x11.handle,
                          xpos, ypos, mode.width, mode.height);
    }

    if (_glfw.x11.xinerama.available && _glfw.x11.NET_WM_FULLSCREEN_MONITORS)
    {
        sendEventToWM(window,
                      _glfw.x11.NET_WM_FULLSCREEN_MONITORS,
                      window->monitor->x11.index,
                      window->monitor->x11.index,
                      window->monitor->x11.index,
                      window->monitor->x11.index,
                      0);
    }

    if (_glfw.x11.NET_ACTIVE_WINDOW)
    {
        // Ask the window manager to raise and focus the GLFW window
        // Only focused windows with the _NET_WM_STATE_FULLSCREEN state end up
        // on top of all other windows ("Stacking order" in EWMH spec)
        sendEventToWM(window, _glfw.x11.NET_ACTIVE_WINDOW, 1, 0, 0, 0, 0);
    }
    else
    {
        XRaiseWindow(_glfw.x11.display, window->x11.handle);
        XSetInputFocus(_glfw.x11.display, window->x11.handle,
                       RevertToParent, CurrentTime);
    }

    if (_glfw.x11.NET_WM_STATE && _glfw.x11.NET_WM_STATE_FULLSCREEN)
    {
        // Ask the window manager to make the GLFW window a full screen window
        // Full screen windows are undecorated and, when focused, are kept
        // on top of all other windows
        sendEventToWM(window,
                      _glfw.x11.NET_WM_STATE,
                      _NET_WM_STATE_ADD,
                      _glfw.x11.NET_WM_STATE_FULLSCREEN,
                      0, 1, 0);
    }
}